

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsIsRuntimeExecutionDisabled(JsRuntimeHandle runtimeHandle,bool *isDisabled)

{
  bool bVar1;
  JsrtRuntime *this;
  ThreadContext *this_00;
  ThreadContext *threadContext;
  bool *isDisabled_local;
  JsRuntimeHandle runtimeHandle_local;
  
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    runtimeHandle_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (isDisabled == (bool *)0x0) {
    runtimeHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *isDisabled = false;
    this = JsrtRuntime::FromHandle(runtimeHandle);
    this_00 = JsrtRuntime::GetThreadContext(this);
    bVar1 = ThreadContext::IsExecutionDisabled(this_00);
    *isDisabled = bVar1;
    runtimeHandle_local._4_4_ = JsNoError;
  }
  return runtimeHandle_local._4_4_;
}

Assistant:

CHAKRA_API JsIsRuntimeExecutionDisabled(_In_ JsRuntimeHandle runtimeHandle, _Out_ bool *isDisabled)
{
    VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);
    PARAM_NOT_NULL(isDisabled);
    *isDisabled = false;

    ThreadContext* threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
    *isDisabled = threadContext->IsExecutionDisabled();
    return JsNoError;
}